

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

void * yang_read_ext(lys_module *module,void *actual,char *ext_name,char *ext_arg,
                    yytokentype actual_type,yytokentype backup_type,int is_ext_instance)

{
  long lVar1;
  lys_ext_instance *plVar2;
  char *pcVar3;
  long *plVar4;
  char cVar5;
  uint8_t uVar6;
  LY_STMT stmt;
  LY_STMT LVar7;
  lyext_substmt *local_58;
  char *local_50;
  lys_module *local_48;
  lys_ext *local_40;
  yytokentype local_34;
  
  local_50 = ext_arg;
  local_48 = module;
  local_40 = (lys_ext *)ext_name;
  local_34 = backup_type;
  if (backup_type == NODE) {
    LVar7 = LY_STMT_ARGUMENT;
    if (actual_type != ARGUMENT_KEYWORD) {
      LVar7 = (uint)(actual_type == BELONGS_TO_KEYWORD) * 3;
    }
    uVar6 = '\0';
    goto LAB_00155393;
  }
  switch(actual_type) {
  case BASE_KEYWORD:
    LVar7 = LY_STMT_BASE;
    if (backup_type == TYPE_KEYWORD) {
      uVar6 = *(uint8_t *)(*(long *)((long)actual + 0x10) + 0x28);
      actual_type = backup_type;
      goto LAB_00155393;
    }
    if (backup_type == IDENTITY_KEYWORD) {
LAB_0015547e:
      uVar6 = *(uint8_t *)((long)actual + 0x1f);
      actual_type = backup_type;
      goto LAB_00155393;
    }
    break;
  case BELONGS_TO_KEYWORD:
  case BIT_KEYWORD:
  case CASE_KEYWORD:
  case CHOICE_KEYWORD:
  case CONTAINER_KEYWORD:
  case ENUM_KEYWORD:
  case EXTENSION_KEYWORD:
  case DEVIATION_KEYWORD:
  case DEVIATE_KEYWORD:
  case FEATURE_KEYWORD:
  case GROUPING_KEYWORD:
  case IDENTITY_KEYWORD:
  case IF_FEATURE_KEYWORD:
  case IMPORT_KEYWORD:
  case INCLUDE_KEYWORD:
  case INPUT_KEYWORD:
  case LEAF_KEYWORD:
  case LEAF_LIST_KEYWORD:
  case LENGTH_KEYWORD:
  case LIST_KEYWORD:
  case MODULE_KEYWORD:
  case MUST_KEYWORD:
  case NOTIFICATION_KEYWORD:
  case OUTPUT_KEYWORD:
  case PATTERN_KEYWORD:
  case RANGE_KEYWORD:
  case REFINE_KEYWORD:
  case REVISION_KEYWORD:
  case RPC_KEYWORD:
  case SUBMODULE_KEYWORD:
  case TYPE_KEYWORD:
  case TYPEDEF_KEYWORD:
  case USES_KEYWORD:
  case WHEN_KEYWORD:
switchD_001551d6_caseD_116:
    ly_log(module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_yang.c"
           ,0x96e);
    return (void *)0x0;
  case CONFIG_KEYWORD:
    LVar7 = LY_STMT_CONFIG;
    break;
  case CONTACT_KEYWORD:
    LVar7 = LY_STMT_CONTACT;
    break;
  case DEFAULT_KEYWORD:
    LVar7 = LY_STMT_DEFAULT;
    if (backup_type == ADD_KEYWORD) {
      uVar6 = *(uint8_t *)((long)actual + 5);
      actual_type = backup_type;
      goto LAB_00155393;
    }
    if (backup_type == REFINE_KEYWORD) goto LAB_0015547e;
    if (backup_type == LEAF_LIST_KEYWORD) {
      uVar6 = *(uint8_t *)((long)actual + 0x1e);
      actual_type = backup_type;
      goto LAB_00155393;
    }
    break;
  case DESCRIPTION_KEYWORD:
    LVar7 = LY_STMT_DESCRIPTION;
    break;
  case ERROR_APP_TAG_KEYWORD:
    LVar7 = LY_STMT_ERRTAG;
    break;
  case ERROR_MESSAGE_KEYWORD:
    LVar7 = LY_STMT_ERRMSG;
    break;
  case FRACTION_DIGITS_KEYWORD:
    LVar7 = LY_STMT_DIGITS;
    break;
  case KEY_KEYWORD:
    LVar7 = LY_STMT_KEY;
    break;
  case MANDATORY_KEYWORD:
    LVar7 = LY_STMT_MANDATORY;
    break;
  case MAX_ELEMENTS_KEYWORD:
    LVar7 = LY_STMT_MAX;
    break;
  case MIN_ELEMENTS_KEYWORD:
    LVar7 = LY_STMT_MIN;
    break;
  case NAMESPACE_KEYWORD:
    LVar7 = LY_STMT_NAMESPACE;
    break;
  case ORDERED_BY_KEYWORD:
    LVar7 = LY_STMT_ORDEREDBY;
    break;
  case ORGANIZATION_KEYWORD:
    LVar7 = LY_STMT_ORGANIZATION;
    break;
  case PATH_KEYWORD:
    LVar7 = LY_STMT_PATH;
    break;
  case POSITION_KEYWORD:
    LVar7 = LY_STMT_POSITION;
    break;
  case PREFIX_KEYWORD:
    LVar7 = LY_STMT_PREFIX;
    break;
  case PRESENCE_KEYWORD:
    LVar7 = LY_STMT_PRESENCE;
    break;
  case REFERENCE_KEYWORD:
    LVar7 = LY_STMT_REFERENCE;
    break;
  case REQUIRE_INSTANCE_KEYWORD:
    LVar7 = LY_STMT_REQINSTANCE;
    break;
  case REVISION_DATE_KEYWORD:
    LVar7 = LY_STMT_REVISIONDATE;
    break;
  case STATUS_KEYWORD:
    LVar7 = LY_STMT_STATUS;
    break;
  case UNIQUE_KEYWORD:
    LVar7 = LY_STMT_UNIQUE;
    if ((int)backup_type < 0x155) {
      if (backup_type == LIST_KEYWORD) goto LAB_0015547e;
      if (backup_type == ADD_KEYWORD) goto LAB_0015549c;
    }
    else if ((backup_type == DELETE_KEYWORD) || (backup_type == REPLACE_KEYWORD)) {
LAB_0015549c:
      uVar6 = *(uint8_t *)((long)actual + 10);
      actual_type = backup_type;
      goto LAB_00155393;
    }
    break;
  case UNITS_KEYWORD:
    LVar7 = LY_STMT_UNITS;
    break;
  case VALUE_KEYWORD:
    LVar7 = LY_STMT_VALUE;
    break;
  case YANG_VERSION_KEYWORD:
    LVar7 = LY_STMT_VERSION;
    break;
  case YIN_ELEMENT_KEYWORD:
    LVar7 = LY_STMT_YINELEM;
    break;
  default:
    if (actual_type != MODIFIER_KEYWORD) goto switchD_001551d6_caseD_116;
    LVar7 = LY_STMT_MODIFIER;
  }
  uVar6 = '\0';
  actual_type = backup_type;
LAB_00155393:
  plVar2 = yang_ext_instance(actual,actual_type,is_ext_instance);
  if (plVar2 == (lys_ext_instance *)0x0) {
    plVar2 = (lys_ext_instance *)0x0;
  }
  else {
    plVar2->insubstmt = (uint8_t)LVar7;
    plVar2->insubstmt_index = uVar6;
    *(byte *)&plVar2->flags = (byte)plVar2->flags | 2;
    plVar2->def = local_40;
    pcVar3 = lydict_insert_zc(local_48->ctx,local_50);
    plVar2->arg_value = pcVar3;
    if ((LVar7 != LY_STMT_UNKNOWN && is_ext_instance != 0) && (plVar2->parent_type == '\v')) {
      if (LVar7 == LY_STMT_BELONGSTO || local_34 == BELONGS_TO_KEYWORD) {
        cVar5 = -1;
        stmt = LY_STMT_BELONGSTO;
      }
      else {
        stmt = LY_STMT_ARGUMENT;
        if (local_34 != ARGUMENT_KEYWORD) {
          stmt = LVar7;
        }
        cVar5 = -(local_34 == ARGUMENT_KEYWORD || LVar7 == LY_STMT_ARGUMENT);
      }
      plVar4 = (long *)lys_ext_complex_get_substmt
                                 (stmt,(lys_ext_instance_complex *)actual,&local_58);
      if (((plVar4 == (long *)0x0) || (local_58->cardinality < LY_STMT_CARD_SOME)) ||
         (plVar4 = (long *)*plVar4, plVar4 == (long *)0x0)) {
        uVar6 = '\0';
      }
      else {
        uVar6 = cVar5 + 0xff;
        do {
          uVar6 = uVar6 + '\x01';
          lVar1 = *plVar4;
          plVar4 = plVar4 + 1;
        } while (lVar1 != 0);
      }
      plVar2->insubstmt_index = uVar6;
    }
  }
  return plVar2;
}

Assistant:

void *
yang_read_ext(struct lys_module *module, void *actual, char *ext_name, char *ext_arg,
              enum yytokentype actual_type, enum yytokentype backup_type, int is_ext_instance)
{
    struct lys_ext_instance *instance;
    LY_STMT stmt = LY_STMT_UNKNOWN;
    LYEXT_SUBSTMT insubstmt;
    uint8_t insubstmt_index = 0;

    if (backup_type != NODE) {
        switch (actual_type) {
        case YANG_VERSION_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_VERSION;
            stmt = LY_STMT_VERSION;
            break;
        case NAMESPACE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_NAMESPACE;
            stmt = LY_STMT_NAMESPACE;
            break;
        case PREFIX_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_PREFIX;
            stmt = LY_STMT_PREFIX;
            break;
        case REVISION_DATE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_REVISIONDATE;
            stmt = LY_STMT_REVISIONDATE;
            break;
        case DESCRIPTION_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_DESCRIPTION;
            stmt = LY_STMT_DESCRIPTION;
            break;
        case REFERENCE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_REFERENCE;
            stmt = LY_STMT_REFERENCE;
            break;
        case CONTACT_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_CONTACT;
            stmt = LY_STMT_CONTACT;
            break;
        case ORGANIZATION_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_ORGANIZATION;
            stmt = LY_STMT_ORGANIZATION;
            break;
        case YIN_ELEMENT_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_YINELEM;
            stmt = LY_STMT_YINELEM;
            break;
        case STATUS_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_STATUS;
            stmt = LY_STMT_STATUS;
            break;
        case BASE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_BASE;
            stmt = LY_STMT_BASE;
            if (backup_type == IDENTITY_KEYWORD) {
                insubstmt_index = ((struct lys_ident *)actual)->base_size;
            } else if (backup_type == TYPE_KEYWORD) {
                insubstmt_index = ((struct yang_type *)actual)->type->info.ident.count;
            }
            break;
        case DEFAULT_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_DEFAULT;
            stmt = LY_STMT_DEFAULT;
            switch (backup_type) {
            case LEAF_LIST_KEYWORD:
                insubstmt_index = ((struct lys_node_leaflist *)actual)->dflt_size;
                break;
            case REFINE_KEYWORD:
                insubstmt_index = ((struct lys_refine *)actual)->dflt_size;
                break;
            case ADD_KEYWORD:
                insubstmt_index = ((struct lys_deviate *)actual)->dflt_size;
                break;
            default:
                /* nothing changes */
                break;
            }
            break;
        case UNITS_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_UNITS;
            stmt = LY_STMT_UNITS;
            break;
        case REQUIRE_INSTANCE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_REQINSTANCE;
            stmt = LY_STMT_REQINSTANCE;
            break;
        case PATH_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_PATH;
            stmt = LY_STMT_PATH;
            break;
        case ERROR_MESSAGE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_ERRMSG;
            stmt = LY_STMT_ERRMSG;
            break;
        case ERROR_APP_TAG_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_ERRTAG;
            stmt = LY_STMT_ERRTAG;
            break;
        case MODIFIER_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_MODIFIER;
            stmt = LY_STMT_MODIFIER;
            break;
        case FRACTION_DIGITS_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_DIGITS;
            stmt = LY_STMT_DIGITS;
            break;
        case VALUE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_VALUE;
            stmt = LY_STMT_VALUE;
            break;
        case POSITION_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_POSITION;
            stmt = LY_STMT_POSITION;
            break;
        case PRESENCE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_PRESENCE;
            stmt = LY_STMT_PRESENCE;
            break;
        case CONFIG_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_CONFIG;
            stmt = LY_STMT_CONFIG;
            break;
        case MANDATORY_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_MANDATORY;
            stmt = LY_STMT_MANDATORY;
            break;
        case MIN_ELEMENTS_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_MIN;
            stmt = LY_STMT_MIN;
            break;
        case MAX_ELEMENTS_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_MAX;
            stmt = LY_STMT_MAX;
            break;
        case ORDERED_BY_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_ORDEREDBY;
            stmt = LY_STMT_ORDEREDBY;
            break;
        case KEY_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_KEY;
            stmt = LY_STMT_KEY;
            break;
        case UNIQUE_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_UNIQUE;
            stmt = LY_STMT_UNIQUE;
            switch (backup_type) {
            case LIST_KEYWORD:
                insubstmt_index = ((struct lys_node_list *)actual)->unique_size;
                break;
            case ADD_KEYWORD:
            case DELETE_KEYWORD:
            case REPLACE_KEYWORD:
                insubstmt_index = ((struct lys_deviate *)actual)->unique_size;
                break;
            default:
                /* nothing changes */
                break;
            }
            break;
        default:
            LOGINT(module->ctx);
            return NULL;
        }

        instance = yang_ext_instance(actual, backup_type, is_ext_instance);
    } else {
        switch (actual_type) {
        case ARGUMENT_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_ARGUMENT;
            stmt = LY_STMT_ARGUMENT;
            break;
        case BELONGS_TO_KEYWORD:
            insubstmt = LYEXT_SUBSTMT_BELONGSTO;
            stmt = LY_STMT_BELONGSTO;
            break;
        default:
            insubstmt = LYEXT_SUBSTMT_SELF;
            break;
        }

        instance = yang_ext_instance(actual, actual_type, is_ext_instance);
    }

    if (!instance) {
        return NULL;
    }
    instance->insubstmt = insubstmt;
    instance->insubstmt_index = insubstmt_index;
    instance->flags |= LYEXT_OPT_YANG;
    instance->def = (struct lys_ext *)ext_name;    /* hack for UNRES */
    instance->arg_value = lydict_insert_zc(module->ctx, ext_arg);
    if (is_ext_instance && stmt != LY_STMT_UNKNOWN && instance->parent_type == LYEXT_PAR_EXTINST) {
        instance->insubstmt_index = yang_fill_ext_substm_index(actual, stmt, backup_type);
    }
    return instance;
}